

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBoolean.c
# Opt level: O0

JsObject * JsCreateBooleanObject(JsObject *prototype,int boolean)

{
  JsObject *o;
  uint *puVar1;
  int *p;
  JsObject *b;
  int boolean_local;
  JsObject *prototype_local;
  
  o = JsAllocObject(1);
  JsCreateStandardObject(o);
  if (prototype != (JsObject *)0x0) {
    o->Prototype = prototype;
  }
  o->Class = "Boolean";
  puVar1 = (uint *)JsMalloc(4);
  *puVar1 = (uint)(boolean != 0);
  o->sb[1] = puVar1;
  return o;
}

Assistant:

static struct JsObject* JsCreateBooleanObject(struct JsObject* prototype,int boolean){
	struct JsObject* b = JsAllocObject(JS_BOOLEAN_FLOOR);
	JsCreateStandardObject(b);
	if(prototype != NULL)
		b->Prototype = prototype;
	b->Class = "Boolean";
	
	//初始化自己的Sb
	int* p = (int*)JsMalloc(sizeof(int));
	*p = (boolean != 0 ? TRUE:FALSE);
	b->sb[JS_BOOLEAN_FLOOR] = p;
	return b;
}